

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_fwd_uload(jit_State *J)

{
  IRIns *pIVar1;
  ushort uVar2;
  uint uVar3;
  AliasRet AVar4;
  TRef TVar5;
  IRIns *pIVar6;
  IRIns *ir;
  IRIns *store;
  IRRef ref;
  IRIns *xr;
  IRRef lim;
  IRRef uref;
  jit_State *J_local;
  
  uVar3 = (uint)(J->fold).ins.field_0.op1;
  xr._0_4_ = 0x8000;
  pIVar6 = (J->cur).ir;
  uVar2 = J->chain[0x4c];
  do {
    store._4_4_ = (uint)uVar2;
    if (store._4_4_ < 0x8001) {
LAB_00141664:
      uVar2 = J->chain[0x44];
      while( true ) {
        store._4_4_ = (uint)uVar2;
        if (store._4_4_ <= (uint)xr) {
          TVar5 = lj_ir_emit(J);
          return TVar5;
        }
        pIVar6 = (J->cur).ir + store._4_4_;
        if (((pIVar6->field_0).op1 == uVar3) ||
           (((J->cur).ir[(pIVar6->field_0).op1].field_1.op12 == (J->cur).ir[uVar3].field_1.op12 &&
            (*(char *)((long)(J->cur).ir + (ulong)(pIVar6->field_0).op1 * 8 + 5) ==
             *(char *)((long)(J->cur).ir + (ulong)uVar3 * 8 + 5))))) break;
        uVar2 = (pIVar6->field_0).prev;
      }
      return store._4_4_;
    }
    pIVar1 = (J->cur).ir + store._4_4_;
    AVar4 = aa_uref(pIVar6 + uVar3,(J->cur).ir + (pIVar1->field_0).op1);
    if (AVar4 != ALIAS_NO) {
      if (AVar4 == ALIAS_MAY) {
        xr._0_4_ = store._4_4_;
        goto LAB_00141664;
      }
      if (AVar4 == ALIAS_MUST) {
        return (uint)(pIVar1->field_0).op2;
      }
    }
    uVar2 = (pIVar1->field_0).prev;
  } while( true );
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_uload(jit_State *J)
{
  IRRef uref = fins->op1;
  IRRef lim = REF_BASE;  /* Search limit. */
  IRIns *xr = IR(uref);
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[IR_USTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    switch (aa_uref(xr, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  ref = J->chain[IR_ULOAD];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op1 == uref ||
	(IR(ir->op1)->op12 == IR(uref)->op12 && IR(ir->op1)->o == IR(uref)->o))
      return ref;  /* Match for identical or equal UREFx (non-CSEable UREFO). */
    ref = ir->prev;
  }
  return lj_ir_emit(J);
}